

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ProxyConfig *this;
  DNSCache *pDVar3;
  ProxyClient client;
  ProxyClient PStack_758;
  
  this = ProxyConfig::getInstance();
  bVar1 = ProxyConfig::initWithArgs(this,argc,argv);
  iVar2 = -1;
  if (bVar1) {
    net_uv::net_setLogLevel(1);
    pDVar3 = net_uv::DNSCache::getInstance();
    pDVar3->m_isEnable = true;
    ProxyClient::ProxyClient(&PStack_758);
    bVar1 = ProxyClient::start(&PStack_758);
    if (!bVar1) {
      puts("start fail...");
    }
    ProxyClient::~ProxyClient(&PStack_758);
    net_uv::printMemInfo();
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
	if (!ProxyConfig::getInstance()->initWithArgs(argc, argv))
		return -1;

	net_uv::net_setLogLevel(NET_UV_L_INFO);
	net_uv::DNSCache::getInstance()->setEnable(true);
	{
		ProxyClient client;
		
		if (!client.start())
		{
			printf("start fail...\n");
		}
	}
	printMemInfo();
	return 0;
}